

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O0

void __thiscall xLearn::DMatrix::Serialize(DMatrix *this,string *filename)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  ostream *poVar4;
  size_type sVar5;
  ulong uVar6;
  ostream *poVar7;
  long in_RDI;
  size_t i;
  FILE *file;
  Logger *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffcf8;
  allocator *function;
  undefined8 in_stack_fffffffffffffd00;
  int iVar8;
  string *in_stack_fffffffffffffd08;
  undefined8 in_stack_fffffffffffffd10;
  LogSeverity severity;
  FILE *in_stack_fffffffffffffd90;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffdd8;
  FILE *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  ulong local_178;
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [32];
  Logger local_118;
  allocator local_111;
  string local_110 [16];
  size_t in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  FILE *in_stack_ffffffffffffff10;
  string local_e8 [32];
  Logger local_c8;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  Logger local_78;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  Logger local_14 [5];
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffd10 >> 0x20);
  iVar8 = (int)((ulong)in_stack_fffffffffffffd00 >> 0x20);
  bVar2 = std::__cxx11::string::empty();
  if ((bVar2 & 1) == 1) {
    Logger::Logger(local_14,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/data_structure.h"
               ,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Serialize",&local_71);
    poVar4 = Logger::Start(severity,in_stack_fffffffffffffd08,iVar8,in_stack_fffffffffffffcf8);
    poVar4 = std::operator<<(poVar4,"CHECK_NE failed ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/data_structure.h"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x14e);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"filename.empty()");
    poVar4 = std::operator<<(poVar4," = ");
    bVar3 = (bool)std::__cxx11::string::empty();
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,bVar3);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"true");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,true);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger(in_stack_fffffffffffffc90);
    abort();
  }
  uVar1 = *(uint *)(in_RDI + 0x10);
  sVar5 = std::
          vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
          ::size((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                  *)(in_RDI + 0x18));
  if (uVar1 != sVar5) {
    Logger::Logger(&local_78,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/data_structure.h"
               ,&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"Serialize",&local_c1);
    poVar4 = Logger::Start(severity,in_stack_fffffffffffffd08,iVar8,in_stack_fffffffffffffcf8);
    poVar4 = std::operator<<(poVar4,"CHECK_EQ failed ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/data_structure.h"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x14f);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"row_length");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(uint *)(in_RDI + 0x10));
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"row.size()");
    poVar4 = std::operator<<(poVar4," = ");
    sVar5 = std::
            vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            ::size((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                    *)(in_RDI + 0x18));
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    Logger::~Logger(in_stack_fffffffffffffc90);
    abort();
  }
  uVar1 = *(uint *)(in_RDI + 0x10);
  sVar5 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x30));
  if (uVar1 != sVar5) {
    Logger::Logger(&local_c8,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/data_structure.h"
               ,(allocator *)&stack0xffffffffffffff17);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"Serialize",&local_111);
    poVar4 = Logger::Start(severity,in_stack_fffffffffffffd08,iVar8,in_stack_fffffffffffffcf8);
    poVar4 = std::operator<<(poVar4,"CHECK_EQ failed ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/data_structure.h"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x150);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"row_length");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(uint *)(in_RDI + 0x10));
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"Y.size()");
    poVar4 = std::operator<<(poVar4," = ");
    sVar5 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x30));
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
    Logger::~Logger(in_stack_fffffffffffffc90);
    abort();
  }
  uVar6 = (ulong)*(uint *)(in_RDI + 0x10);
  sVar5 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x48));
  if (uVar6 != sVar5) {
    Logger::Logger(&local_118,ERR);
    iVar8 = (int)(uVar6 >> 0x20);
    function = &local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/data_structure.h"
               ,function);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"Serialize",&local_161);
    poVar4 = Logger::Start(severity,in_stack_fffffffffffffd08,iVar8,(string *)function);
    poVar4 = std::operator<<(poVar4,"CHECK_EQ failed ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/data_structure.h"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x151);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"row_length");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(uint *)(in_RDI + 0x10));
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"norm.size()");
    poVar4 = std::operator<<(poVar4," = ");
    sVar5 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x48));
    poVar7 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
    std::operator<<(poVar7,"\n");
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    Logger::~Logger((Logger *)poVar4);
    abort();
  }
  std::__cxx11::string::c_str();
  OpenFileOrDie(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  WriteDataToDisk(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  WriteDataToDisk(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  WriteDataToDisk(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  for (local_178 = 0; local_178 < *(uint *)(in_RDI + 0x10); local_178 = local_178 + 1) {
    std::
    vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
    ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                  *)(in_RDI + 0x18),local_178);
    WriteVectorToFile<xLearn::Node>
              (in_stack_fffffffffffffde0,
               (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)in_stack_fffffffffffffdd8);
  }
  WriteVectorToFile<float>(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  WriteVectorToFile<float>(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  WriteDataToDisk(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  WriteDataToDisk(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  Close(in_stack_fffffffffffffd90);
  return;
}

Assistant:

void Serialize(const std::string& filename) {
    CHECK_NE(filename.empty(), true);
    CHECK_EQ(row_length, row.size());
    CHECK_EQ(row_length, Y.size());
    CHECK_EQ(row_length, norm.size());
#ifndef _MSC_VER
    FILE* file = OpenFileOrDie(filename.c_str(), "w");
#else
    FILE* file = OpenFileOrDie(filename.c_str(), "wb");
#endif
    // Write hash_value
    WriteDataToDisk(file, (char*)&hash_value_1, sizeof(hash_value_1));
    WriteDataToDisk(file, (char*)&hash_value_2, sizeof(hash_value_2));
    // Write row_length
    WriteDataToDisk(file, (char*)&row_length, sizeof(row_length));
    // Write row
    for (size_t i = 0; i < row_length; ++i) {
      WriteVectorToFile(file, *(row[i]));
    }
    // Write Y
    WriteVectorToFile(file, Y);
    // Write norm
    WriteVectorToFile(file, norm);
    // Write has_label
    WriteDataToDisk(file, (char*)&has_label, sizeof(has_label));
    // Write pos
    WriteDataToDisk(file, (char*)&pos, sizeof(pos));
    Close(file);
  }